

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O0

void __thiscall
delta_complex_cell_t::compute_boundary
          (delta_complex_cell_t *this,delta_complex_t *complex,size_t thread,
          vector<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::allocator<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>
          *new_cell_cofaces)

{
  size_type sVar1;
  ulong uVar2;
  reference pvVar3;
  reference pvVar4;
  reference this_00;
  index_t iVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  size_type *psVar9;
  reference pvVar10;
  reference this_01;
  bool bVar11;
  pair<long,_long> pVar12;
  vector<long,_std::allocator<long>_> local_138;
  pair<long,_long> local_120;
  vector<long,_std::allocator<long>_> local_110;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  local_f8;
  vector<long,_std::allocator<long>_> local_e0;
  byte local_c1;
  vector<long,_std::allocator<long>_> local_c0;
  int local_a4;
  byte local_9d;
  int f;
  undefined1 auStack_98 [3];
  bool found;
  int k;
  pointer plStack_90;
  pointer local_88;
  int local_64;
  undefined1 local_60 [4];
  int j;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  tempOrient;
  vector<long,_std::allocator<long>_> temp;
  int i;
  vector<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::allocator<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>
  *new_cell_cofaces_local;
  size_t thread_local;
  delta_complex_t *complex_local;
  delta_complex_cell_t *this_local;
  
  temp.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  while( true ) {
    sVar1 = std::vector<long,_std::allocator<long>_>::size(&this->vertices);
    if (sVar1 <= (ulong)(long)temp.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage._4_4_) break;
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)
               &tempOrient.
                super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              *)local_60);
    local_64 = 0;
    while( true ) {
      uVar2 = (ulong)local_64;
      sVar1 = std::vector<long,_std::allocator<long>_>::size(&this->vertices);
      if (sVar1 <= uVar2) break;
      if (local_64 !=
          temp.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_) {
        pvVar3 = std::vector<long,_std::allocator<long>_>::operator[]
                           (&this->vertices,(long)local_64);
        std::vector<long,_std::allocator<long>_>::push_back
                  ((vector<long,_std::allocator<long>_> *)
                   &tempOrient.
                    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar3);
        if ((local_64 <
             temp.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_) && (0 < local_64)) {
          pvVar4 = std::
                   vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   ::operator[](&this->orientation,(long)(local_64 + -1));
          std::
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ::push_back((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                       *)local_60,pvVar4);
        }
        else if ((temp.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_ < local_64) && (1 < local_64)) {
          _auStack_98 = (pointer)0x0;
          plStack_90 = (pointer)0x0;
          local_88 = (pointer)0x0;
          std::vector<long,_std::allocator<long>_>::vector
                    ((vector<long,_std::allocator<long>_> *)auStack_98);
          std::
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ::push_back((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                       *)local_60,(vector<long,_std::allocator<long>_> *)auStack_98);
          std::vector<long,_std::allocator<long>_>::~vector
                    ((vector<long,_std::allocator<long>_> *)auStack_98);
          f = 0;
          while( true ) {
            uVar2 = (ulong)f;
            pvVar4 = std::
                     vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                     ::operator[](&this->orientation,(long)(local_64 + -1));
            sVar1 = std::vector<long,_std::allocator<long>_>::size(pvVar4);
            if (sVar1 <= uVar2) break;
            if (f != temp.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_) {
              pvVar4 = std::
                       vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                       ::back((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                               *)local_60);
              this_00 = std::
                        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                        ::operator[](&this->orientation,(long)(local_64 + -1));
              pvVar3 = std::vector<long,_std::allocator<long>_>::operator[](this_00,(long)f);
              std::vector<long,_std::allocator<long>_>::push_back(pvVar4,pvVar3);
            }
            f = f + 1;
          }
        }
      }
      local_64 = local_64 + 1;
    }
    local_9d = 0;
    local_a4 = 0;
    while( true ) {
      local_c1 = 0;
      bVar11 = false;
      if ((local_9d & 1) == 0) {
        uVar2 = (ulong)local_a4;
        iVar5 = dimension(this);
        pvVar6 = std::
                 vector<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
                 ::operator[](&complex->cliques,iVar5 - 1);
        std::vector<long,_std::allocator<long>_>::vector
                  (&local_c0,
                   (vector<long,_std::allocator<long>_> *)
                   &tempOrient.
                    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_c1 = 1;
        sVar1 = delta_complex_t::get_clique(complex,&local_c0);
        pvVar7 = std::vector<clique_t,_std::allocator<clique_t>_>::operator[](pvVar6,sVar1);
        sVar1 = std::vector<long,_std::allocator<long>_>::size(&pvVar7->faces);
        bVar11 = uVar2 < sVar1;
      }
      if ((local_c1 & 1) != 0) {
        std::vector<long,_std::allocator<long>_>::~vector(&local_c0);
      }
      if (!bVar11) break;
      iVar5 = dimension(this);
      pvVar8 = std::
               vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
               ::operator[](&complex->cells,iVar5 - 1);
      iVar5 = dimension(this);
      pvVar6 = std::
               vector<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
               ::operator[](&complex->cliques,iVar5 - 1);
      std::vector<long,_std::allocator<long>_>::vector
                (&local_e0,
                 (vector<long,_std::allocator<long>_> *)
                 &tempOrient.
                  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      sVar1 = delta_complex_t::get_clique(complex,&local_e0);
      pvVar7 = std::vector<clique_t,_std::allocator<clique_t>_>::operator[](pvVar6,sVar1);
      psVar9 = (size_type *)
               std::vector<long,_std::allocator<long>_>::operator[](&pvVar7->faces,(long)local_a4);
      pvVar10 = std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::operator[]
                          (pvVar8,*psVar9);
      std::
      vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ::vector(&local_f8,
               (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                *)local_60);
      bVar11 = same_orientation(pvVar10,&local_f8);
      std::
      vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ::~vector(&local_f8);
      std::vector<long,_std::allocator<long>_>::~vector(&local_e0);
      if (bVar11) {
        iVar5 = dimension(this);
        pvVar8 = std::
                 vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                 ::operator[](&complex->cells,iVar5 - 1);
        iVar5 = dimension(this);
        pvVar6 = std::
                 vector<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
                 ::operator[](&complex->cliques,iVar5 - 1);
        std::vector<long,_std::allocator<long>_>::vector
                  (&local_110,
                   (vector<long,_std::allocator<long>_> *)
                   &tempOrient.
                    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        sVar1 = delta_complex_t::get_clique(complex,&local_110);
        pvVar7 = std::vector<clique_t,_std::allocator<clique_t>_>::operator[](pvVar6,sVar1);
        psVar9 = (size_type *)
                 std::vector<long,_std::allocator<long>_>::operator[](&pvVar7->faces,(long)local_a4)
        ;
        pvVar10 = std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::
                  operator[](pvVar8,*psVar9);
        std::vector<long,_std::allocator<long>_>::push_back(&this->boundary,&pvVar10->location);
        std::vector<long,_std::allocator<long>_>::~vector(&local_110);
        this_01 = std::
                  vector<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::allocator<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>
                  ::operator[](new_cell_cofaces,thread);
        iVar5 = dimension(this);
        pvVar6 = std::
                 vector<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
                 ::operator[](&complex->cliques,iVar5 - 1);
        std::vector<long,_std::allocator<long>_>::vector
                  (&local_138,
                   (vector<long,_std::allocator<long>_> *)
                   &tempOrient.
                    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        sVar1 = delta_complex_t::get_clique(complex,&local_138);
        pvVar7 = std::vector<clique_t,_std::allocator<clique_t>_>::operator[](pvVar6,sVar1);
        pvVar3 = std::vector<long,_std::allocator<long>_>::operator[](&pvVar7->faces,(long)local_a4)
        ;
        pVar12 = std::make_pair<long&,long&>(pvVar3,&this->location);
        local_120 = pVar12;
        std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::push_back
                  (this_01,&local_120);
        std::vector<long,_std::allocator<long>_>::~vector(&local_138);
        local_9d = 1;
      }
      local_a4 = local_a4 + 1;
    }
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               *)local_60);
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)
               &tempOrient.
                super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    temp.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ =
         temp.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_ + 1;
  }
  return;
}

Assistant:

void delta_complex_cell_t::compute_boundary(delta_complex_t* complex, size_t thread, std::vector<std::vector<std::pair<index_t, index_t>>>& new_cell_cofaces){
	//For each vertex delete it from the face, by removing it from the vertex set and
	//the relevant rows and columns of the orientation matrix
	//find this face in the complex and add its index to the boundary of the cell,
	//also add this cell to the coboundary of the found cell
	for(int i = 0; i < vertices.size(); i++){
		std::vector<index_t> temp;
		std::vector<std::vector<index_t>> tempOrient;
		for(int j = 0; j < vertices.size(); j++){
			if(j != i){
				temp.push_back(vertices[j]);
				if(j < i && j > 0){ tempOrient.push_back(orientation[j-1]);
				} else if(j > i && j > 1){
					tempOrient.push_back(std::vector<index_t>());
					for(int k = 0; k < orientation[j-1].size(); k++){
						if(k != i){
							tempOrient.back().push_back(orientation[j-1][k]);
						}
					}
				}
			}
		}
        bool found = false;
        int f = 0;
        while(!found && f < complex->cliques[dimension()-1][complex->get_clique(temp)].faces.size()){
			if(complex->cells[dimension()-1][complex->cliques[dimension()-1][complex->get_clique(temp)].faces[f]].same_orientation(tempOrient)){
				boundary.push_back(complex->cells[dimension()-1][complex->cliques[dimension()-1][complex->get_clique(temp)].faces[f]].location);
                new_cell_cofaces[thread].push_back(std::make_pair(complex->cliques[dimension()-1][complex->get_clique(temp)].faces[f],location));
				found = true;
			}
            f++;
		}
	}
}